

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O1

void ecs_dbg_entity(ecs_world_t *world,ecs_entity_t entity,ecs_dbg_entity_t *dbg_out)

{
  _Bool _Var1;
  ecs_type_t peVar2;
  ecs_entity_info_t info;
  ecs_entity_info_t local_28;
  
  dbg_out->entity = entity;
  dbg_out->table = (ecs_table_t *)0x0;
  dbg_out->type = (ecs_type_t)0x0;
  dbg_out->row = 0;
  dbg_out->is_watched = false;
  *(undefined3 *)&dbg_out->field_0x1d = 0;
  local_28.data = (ecs_data_t *)0x0;
  local_28.row = 0;
  local_28.is_watched = false;
  local_28._29_3_ = 0;
  local_28.record = (ecs_record_t *)0x0;
  local_28.table = (ecs_table_t *)0x0;
  _Var1 = ecs_get_info(world,entity,&local_28);
  if (_Var1) {
    dbg_out->table = local_28.table;
    dbg_out->row = local_28.row;
    dbg_out->is_watched = local_28.is_watched;
    if (local_28.table == (ecs_table_t *)0x0) {
      peVar2 = (ecs_type_t)0x0;
    }
    else {
      peVar2 = (local_28.table)->type;
    }
    dbg_out->type = peVar2;
  }
  return;
}

Assistant:

void ecs_dbg_entity(
    ecs_world_t *world, 
    ecs_entity_t entity, 
    ecs_dbg_entity_t *dbg_out)
{
    *dbg_out = (ecs_dbg_entity_t){.entity = entity};
    
    ecs_entity_info_t info = { 0 };
    if (ecs_get_info(world, entity, &info)) {
        dbg_out->table = info.table;
        dbg_out->row = info.row;
        dbg_out->is_watched = info.is_watched;
        dbg_out->type = info.table ? info.table->type : NULL;
    }
}